

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall
SmallVector_CtorInitializerList_Test::TestBody(SmallVector_CtorInitializerList_Test *this)

{
  ElementsAreMatcher<std::tuple<int,_int,_int>_> matcher;
  initializer_list<int> init;
  bool bVar1;
  char *pcVar2;
  _Head_base<1UL,_int,_false> in_stack_fffffffffffffe94;
  _Head_base<0UL,_int,_false> in_stack_fffffffffffffe98;
  AssertHelper local_130;
  Message local_128;
  int local_11c [3];
  testing local_110 [8];
  _Tuple_impl<2UL,_int> local_108;
  char local_104 [12];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  Message local_e0;
  size_t local_d8;
  uint local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0 [3];
  size_t local_98;
  uint local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  undefined1 local_58 [8];
  small_vector<int,_8UL> b;
  SmallVector_CtorInitializerList_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 1;
  init._M_len = 3;
  init._M_array =
       (iterator)
       ((long)&gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       + 4);
  b.buffer_ = (int *)this;
  pstore::small_vector<int,_8UL>::small_vector((small_vector<int,_8UL> *)local_58,init);
  local_8c = 3;
  local_98 = pstore::small_vector<int,_8UL>::size((small_vector<int,_8UL> *)local_58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_88,"3U","b.size ()",&local_8c,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_cc = 8;
  local_d8 = pstore::small_vector<int,_8UL>::capacity((small_vector<int,_8UL> *)local_58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c8,"8U","b.capacity ()",&local_cc,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_11c[2] = 1;
  local_11c[1] = 2;
  local_11c[0] = 3;
  testing::ElementsAre<int,int,int>(local_110,local_11c + 2,local_11c + 1,local_11c);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = in_stack_fffffffffffffe94._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       local_108.super__Head_base<2UL,_int,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = in_stack_fffffffffffffe98._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int>>>::
  operator()(local_f8,local_104,(small_vector<int,_8UL> *)0x2bee83);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pstore::small_vector<int,_8UL>::~small_vector((small_vector<int,_8UL> *)local_58);
  return;
}

Assistant:

TEST (SmallVector, CtorInitializerList) {
    pstore::small_vector<int, 8> const b{1, 2, 3};
    EXPECT_EQ (3U, b.size ());
    EXPECT_EQ (8U, b.capacity ());
    EXPECT_THAT (b, ::testing::ElementsAre (1, 2, 3));
}